

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

size_t __thiscall
google::protobuf::(anonymous_namespace)::SymbolByParentHash::operator()
          (SymbolByParentHash *this,Symbol *s)

{
  size_t sVar1;
  pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_> local_30;
  Symbol *local_18;
  Symbol *s_local;
  SymbolByParentHash *this_local;
  
  local_18 = s;
  s_local = (Symbol *)this;
  Symbol::parent_name_key(&local_30,s);
  sVar1 = absl::lts_20250127::
          HashOf<std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
                    (&local_30);
  return sVar1;
}

Assistant:

size_t operator()(const T& s) const {
    return absl::HashOf(s.parent_name_key());
  }